

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

bool FBehavior::StaticCheckAllGood(void)

{
  bool bVar1;
  ulong uVar2;
  
  if (StaticModules.Count == 0) {
    return true;
  }
  uVar2 = 0;
  do {
    bVar1 = IsGood(StaticModules.Array[uVar2]);
    if (!bVar1) {
      return bVar1;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 < StaticModules.Count);
  return bVar1;
}

Assistant:

bool FBehavior::StaticCheckAllGood ()
{
	for (unsigned int i = 0; i < StaticModules.Size(); ++i)
	{
		if (!StaticModules[i]->IsGood())
		{
			return false;
		}
	}
	return true;
}